

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall
mp::SolveResultRegistry::AddSolveResults(SolveResultRegistry *this,SRRegMap *sm,bool ifCanReplace)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  byte in_DL;
  value_type *in_RDI;
  pair<std::_Rb_tree_const_iterator<mp::SolveResultRegistry::RegEntry>,_bool> pVar5;
  RegEntry *sr;
  iterator __end1;
  iterator __begin1;
  SRRegMap *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  set<mp::SolveResultRegistry::RegEntry,_std::less<mp::SolveResultRegistry::RegEntry>,_std::allocator<mp::SolveResultRegistry::RegEntry>_>
  *in_stack_ffffffffffffff48;
  bool local_a9;
  _Rb_tree_const_iterator<mp::SolveResultRegistry::RegEntry> in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff84;
  BasicCStringRef<char> in_stack_ffffffffffffff88;
  CStringRef in_stack_ffffffffffffff90;
  CStringRef in_stack_ffffffffffffff98;
  _Self local_48;
  _Self local_40;
  reference local_38;
  _Self local_30;
  _Self local_28 [2];
  byte local_11;
  
  local_11 = in_DL & 1;
  local_28[0]._M_node =
       (_Base_ptr)
       std::
       set<mp::SolveResultRegistry::RegEntry,_std::less<mp::SolveResultRegistry::RegEntry>,_std::allocator<mp::SolveResultRegistry::RegEntry>_>
       ::begin((set<mp::SolveResultRegistry::RegEntry,_std::less<mp::SolveResultRegistry::RegEntry>,_std::allocator<mp::SolveResultRegistry::RegEntry>_>
                *)in_stack_ffffffffffffff38);
  local_30._M_node =
       (_Base_ptr)
       std::
       set<mp::SolveResultRegistry::RegEntry,_std::less<mp::SolveResultRegistry::RegEntry>,_std::allocator<mp::SolveResultRegistry::RegEntry>_>
       ::end((set<mp::SolveResultRegistry::RegEntry,_std::less<mp::SolveResultRegistry::RegEntry>,_std::allocator<mp::SolveResultRegistry::RegEntry>_>
              *)in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = std::operator!=(local_28,&local_30);
    if (!bVar1) {
      return;
    }
    local_38 = std::_Rb_tree_const_iterator<mp::SolveResultRegistry::RegEntry>::operator*
                         ((_Rb_tree_const_iterator<mp::SolveResultRegistry::RegEntry> *)
                          CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    local_a9 = false;
    if ((local_11 & 1) == 0) {
      local_40._M_node =
           (_Base_ptr)
           std::
           set<mp::SolveResultRegistry::RegEntry,_std::less<mp::SolveResultRegistry::RegEntry>,_std::allocator<mp::SolveResultRegistry::RegEntry>_>
           ::end((set<mp::SolveResultRegistry::RegEntry,_std::less<mp::SolveResultRegistry::RegEntry>,_std::allocator<mp::SolveResultRegistry::RegEntry>_>
                  *)in_stack_ffffffffffffff38);
      local_48._M_node =
           (_Base_ptr)
           std::
           set<mp::SolveResultRegistry::RegEntry,_std::less<mp::SolveResultRegistry::RegEntry>,_std::allocator<mp::SolveResultRegistry::RegEntry>_>
           ::find(in_stack_ffffffffffffff48,
                  (key_type *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      local_a9 = std::operator!=(&local_40,&local_48);
    }
    if (local_a9 != false) break;
    pVar5 = std::
            set<mp::SolveResultRegistry::RegEntry,_std::less<mp::SolveResultRegistry::RegEntry>,_std::allocator<mp::SolveResultRegistry::RegEntry>_>
            ::insert((set<mp::SolveResultRegistry::RegEntry,_std::less<mp::SolveResultRegistry::RegEntry>,_std::allocator<mp::SolveResultRegistry::RegEntry>_>
                      *)in_stack_ffffffffffffff60._M_node,in_RDI);
    in_stack_ffffffffffffff60 = pVar5.first._M_node;
    std::_Rb_tree_const_iterator<mp::SolveResultRegistry::RegEntry>::operator++
              ((_Rb_tree_const_iterator<mp::SolveResultRegistry::RegEntry> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  }
  uVar4 = __cxa_allocate_exception(0x18);
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)&stack0xffffffffffffff88,"Duplicated solve code range {}-{}");
  iVar2 = RegEntry::first(local_38);
  iVar3 = RegEntry::last(local_38);
  fmt::format<int,int>
            (in_stack_ffffffffffffff98,(int *)in_stack_ffffffffffffff90.data_,
             (int *)in_stack_ffffffffffffff88.data_);
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)CONCAT44(iVar2,iVar3),in_stack_ffffffffffffff38);
  Error::Error((Error *)in_stack_ffffffffffffff88.data_,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff84);
  __cxa_throw(uVar4,&Error::typeinfo,Error::~Error);
}

Assistant:

void SolveResultRegistry::AddSolveResults(
    const SRRegMap &sm, bool ifCanReplace) {
  for (const auto& sr : sm) {
    if (!ifCanReplace  // Fail unless ifCanReplace
        && registry_.end()!=registry_.find(sr))
      MP_RAISE(fmt::format(
                 "Duplicated solve code range {}-{}",
                 sr.first(), sr.last()));
    registry_.insert(sr);
  }
}